

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_INT *new_node;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_NODE pRVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  uint uVar8;
  uint map;
  REF_INT RVar9;
  REF_STATUS RVar10;
  void *__s;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  REF_INT RVar14;
  char *pcVar15;
  int iVar16;
  REF_NODE ref_node;
  long lVar17;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_DBL volume;
  ulong local_180;
  ulong local_178;
  REF_NODE local_170;
  REF_INT new_nodes [27];
  REF_INT e5;
  REF_INT e4;
  REF_INT e3;
  REF_INT e2;
  REF_INT e1;
  REF_INT e0;
  REF_INT local_a8;
  REF_INT RStack_a4;
  REF_INT RStack_a0;
  REF_INT RStack_9c;
  
  ref_cell = ref_subdiv->grid->cell[8];
  iVar16 = ref_cell->max;
  if ((long)iVar16 < 0) {
    pcVar15 = "malloc marked_for_removal of REF_INT negative";
    uVar12 = 0x670;
LAB_001c8fad:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar12
           ,"ref_subdiv_split_tet",pcVar15);
    uVar8 = 1;
  }
  else {
    local_170 = ref_subdiv->grid->node;
    __size = (long)iVar16 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x670,"ref_subdiv_split_tet","malloc marked_for_removal of REF_INT NULL");
      uVar8 = 2;
    }
    else {
      if (iVar16 != 0) {
        memset(__s,0,__size);
      }
      uVar8 = ref_cell_create(&ref_cell_split,ref_cell->type);
      if (uVar8 == 0) {
        if (0 < ref_cell->max) {
          uVar13 = 0;
          do {
            iVar16 = (int)uVar13;
            if (ref_cell->c2n[(long)iVar16 * (long)ref_cell->size_per] == -1) goto LAB_001c9e08;
            map = ref_subdiv_map(ref_subdiv,ref_cell,iVar16);
            local_180 = uVar13;
            uVar8 = ref_cell_nodes(ref_cell,iVar16,&local_a8);
            RVar4 = RStack_9c;
            RVar9 = RStack_a0;
            RVar14 = local_a8;
            uVar13 = local_180;
            if (uVar8 != 0) {
              pcVar15 = "nodes";
              uVar12 = 0x675;
              goto LAB_001c8f80;
            }
            if (map < 0x40) {
              uVar11 = (ulong)map;
              if ((0x100010116U >> (uVar11 & 0x3f) & 1) != 0) {
                if (0 < ref_cell->edge_per) {
                  iVar16 = -1;
                  RVar14 = 0;
                  do {
                    pRVar1 = ref_subdiv->mark;
                    RVar9 = ref_subdiv_c2e(ref_subdiv,ref_cell,RVar14,(REF_INT)uVar13);
                    if (pRVar1[RVar9] != 0) {
                      iVar16 = RVar14;
                    }
                    RVar14 = RVar14 + 1;
                  } while (RVar14 < ref_cell->edge_per);
                  if (iVar16 != -1) {
                    RVar14 = ref_subdiv_c2e(ref_subdiv,ref_cell,iVar16,(REF_INT)uVar13);
                    *(undefined4 *)((long)__s + uVar13 * 4) = 1;
                    new_nodes[1] = RStack_a4;
                    new_nodes[0] = local_a8;
                    new_nodes[3] = RStack_9c;
                    new_nodes[2] = RStack_a0;
                    new_nodes[ref_cell->e2n[iVar16 * 2]] = ref_subdiv->node[RVar14];
                    uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar8 == 0) {
                      new_nodes[1] = RStack_a4;
                      new_nodes[0] = local_a8;
                      new_nodes[3] = RStack_9c;
                      new_nodes[2] = RStack_a0;
                      new_nodes[ref_cell->e2n[(int)(iVar16 * 2 | 1)]] = ref_subdiv->node[RVar14];
                      uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                      uVar13 = local_180;
                      if (uVar8 == 0) goto LAB_001c9e08;
                      pcVar15 = "add";
                      uVar12 = 0x691;
                    }
                    else {
                      pcVar15 = "add";
                      uVar12 = 0x68c;
                    }
                    goto LAB_001c8f80;
                  }
                }
                pcVar15 = "edge not found";
                uVar12 = 0x684;
                goto LAB_001c8fad;
              }
              if ((0x100004000200800U >> (uVar11 & 0x3f) & 1) == 0) {
                if (uVar11 != 0x3f) goto LAB_001c9bce;
                *(undefined4 *)((long)__s + local_180 * 4) = 1;
                local_178 = CONCAT44(local_178._4_4_,RStack_a4);
                uVar8 = ref_subdiv_node_between(ref_subdiv,local_a8,RStack_a4,&e0);
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6e9;
                  goto LAB_001c8f80;
                }
                uVar8 = ref_subdiv_node_between(ref_subdiv,local_a8,RStack_a0,&e1);
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6ea;
                  goto LAB_001c8f80;
                }
                uVar8 = ref_subdiv_node_between(ref_subdiv,local_a8,RStack_9c,&e2);
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6eb;
                  goto LAB_001c8f80;
                }
                uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a4,RStack_a0,&e3);
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6ec;
                  goto LAB_001c8f80;
                }
                uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a4,RStack_9c,&e4);
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6ed;
                  goto LAB_001c8f80;
                }
                uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a0,RStack_9c,&e5);
                RVar7 = e0;
                RVar6 = e1;
                RVar5 = e2;
                if (uVar8 != 0) {
                  pcVar15 = "e";
                  uVar12 = 0x6ee;
                  goto LAB_001c8f80;
                }
                new_nodes[1] = e2;
                new_nodes[0] = e0;
                new_nodes[3] = RVar14;
                new_nodes[2] = e1;
                uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                ref_node = local_170;
                if (uVar8 == 0) {
                  uVar8 = ref_node_tet_vol(local_170,new_nodes,&volume);
                  pRVar2 = local_170;
                  if (uVar8 == 0) {
                    if (volume < ref_node->min_volume) {
                      pRVar1 = ref_node->part;
                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",local_180,
                             0x3f,(ulong)(uint)ref_node->ref_mpi->id,(long)new_nodes[0],
                             (ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1],
                             (ulong)(uint)pRVar1[new_nodes[1]],(long)new_nodes[2],
                             (ulong)(uint)pRVar1[new_nodes[2]],(long)new_nodes[3],
                             (ulong)(uint)pRVar1[new_nodes[3]]);
                      ref_node_location(pRVar2,new_nodes[0]);
                      ref_node_location(pRVar2,new_nodes[1]);
                      ref_node_location(pRVar2,new_nodes[2]);
                      ref_node_location(pRVar2,new_nodes[3]);
                      ref_node = pRVar2;
                    }
                    RVar3 = e3;
                    RVar14 = e4;
                    new_nodes[1] = e3;
                    new_nodes[0] = RVar7;
                    new_nodes[3] = (REF_INT)local_178;
                    new_nodes[2] = e4;
                    uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                    if (uVar8 == 0) {
                      uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                      pRVar2 = local_170;
                      if (uVar8 == 0) {
                        if (volume < ref_node->min_volume) {
                          pRVar1 = ref_node->part;
                          local_178 = (ulong)(uint)pRVar1[new_nodes[1]];
                          printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",local_180
                                 ,0x3f,(ulong)(uint)ref_node->ref_mpi->id,(long)new_nodes[0],
                                 (ulong)(uint)pRVar1[new_nodes[0]],(long)new_nodes[1],local_178,
                                 (long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                                 (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                          ref_node_location(pRVar2,new_nodes[0]);
                          ref_node_location(pRVar2,new_nodes[1]);
                          ref_node_location(pRVar2,new_nodes[2]);
                          ref_node_location(pRVar2,new_nodes[3]);
                          ref_node = pRVar2;
                        }
                        local_178 = CONCAT44(local_178._4_4_,e5);
                        new_nodes[1] = e5;
                        new_nodes[0] = RVar6;
                        new_nodes[3] = RVar9;
                        new_nodes[2] = RVar3;
                        uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                        if (uVar8 == 0) {
                          uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                          pRVar2 = local_170;
                          if (uVar8 == 0) {
                            if (volume < ref_node->min_volume) {
                              pRVar1 = ref_node->part;
                              printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                                     local_180,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                                     (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],
                                     (long)new_nodes[1],(ulong)(uint)pRVar1[new_nodes[1]],
                                     (long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                                     (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                              ref_node_location(pRVar2,new_nodes[0]);
                              ref_node_location(pRVar2,new_nodes[1]);
                              ref_node_location(pRVar2,new_nodes[2]);
                              ref_node_location(pRVar2,new_nodes[3]);
                              ref_node = pRVar2;
                            }
                            new_nodes[1] = RVar14;
                            new_nodes[0] = RVar5;
                            new_nodes[3] = RVar4;
                            new_nodes[2] = (REF_INT)local_178;
                            uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                            if (uVar8 == 0) {
                              uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                              pRVar2 = local_170;
                              if (uVar8 == 0) {
                                if (volume < ref_node->min_volume) {
                                  pRVar1 = ref_node->part;
                                  printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                                         local_180,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                                         (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],
                                         (long)new_nodes[1],(ulong)(uint)pRVar1[new_nodes[1]],
                                         (long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                                         (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                                  ref_node_location(pRVar2,new_nodes[0]);
                                  ref_node_location(pRVar2,new_nodes[1]);
                                  ref_node_location(pRVar2,new_nodes[2]);
                                  ref_node_location(pRVar2,new_nodes[3]);
                                  ref_node = pRVar2;
                                }
                                new_nodes[1] = (REF_INT)local_178;
                                new_nodes[0] = RVar7;
                                new_nodes[3] = RVar5;
                                new_nodes[2] = RVar6;
                                uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                                if (uVar8 == 0) {
                                  uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                                  pRVar2 = local_170;
                                  if (uVar8 == 0) {
                                    if (volume < ref_node->min_volume) {
                                      pRVar1 = ref_node->part;
                                      printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                             ,local_180,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                                             (long)new_nodes[0],(ulong)(uint)pRVar1[new_nodes[0]],
                                             (long)new_nodes[1],(ulong)(uint)pRVar1[new_nodes[1]],
                                             (long)new_nodes[2],(ulong)(uint)pRVar1[new_nodes[2]],
                                             (long)new_nodes[3],(ulong)(uint)pRVar1[new_nodes[3]]);
                                      ref_node_location(pRVar2,new_nodes[0]);
                                      ref_node_location(pRVar2,new_nodes[1]);
                                      ref_node_location(pRVar2,new_nodes[2]);
                                      ref_node_location(pRVar2,new_nodes[3]);
                                      ref_node = pRVar2;
                                    }
                                    new_nodes[1] = (REF_INT)local_178;
                                    new_nodes[0] = RVar7;
                                    new_nodes[3] = RVar14;
                                    new_nodes[2] = RVar5;
                                    uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                                    if (uVar8 == 0) {
                                      uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                                      pRVar2 = local_170;
                                      if (uVar8 == 0) {
                                        if (volume < ref_node->min_volume) {
                                          pRVar1 = ref_node->part;
                                          printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                                 ,local_180,0x3f,(ulong)(uint)ref_node->ref_mpi->id,
                                                 (long)new_nodes[0],
                                                 (ulong)(uint)pRVar1[new_nodes[0]],
                                                 (long)new_nodes[1],
                                                 (ulong)(uint)pRVar1[new_nodes[1]],
                                                 (long)new_nodes[2],
                                                 (ulong)(uint)pRVar1[new_nodes[2]],
                                                 (long)new_nodes[3],
                                                 (ulong)(uint)pRVar1[new_nodes[3]]);
                                          ref_node_location(pRVar2,new_nodes[0]);
                                          ref_node_location(pRVar2,new_nodes[1]);
                                          ref_node_location(pRVar2,new_nodes[2]);
                                          ref_node_location(pRVar2,new_nodes[3]);
                                          ref_node = pRVar2;
                                        }
                                        new_nodes[1] = (REF_INT)local_178;
                                        new_nodes[0] = RVar7;
                                        new_nodes[3] = RVar3;
                                        new_nodes[2] = RVar14;
                                        uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
                                        if (uVar8 == 0) {
                                          uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                                          pRVar2 = local_170;
                                          if (uVar8 == 0) {
                                            if (volume < ref_node->min_volume) {
                                              pRVar1 = ref_node->part;
                                              printf(
                                                  "%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                                  ,local_180,0x3f,(ulong)(uint)ref_node->ref_mpi->id
                                                  ,(long)new_nodes[0],
                                                  (ulong)(uint)pRVar1[new_nodes[0]],
                                                  (long)new_nodes[1],
                                                  (ulong)(uint)pRVar1[new_nodes[1]],
                                                  (long)new_nodes[2],
                                                  (ulong)(uint)pRVar1[new_nodes[2]],
                                                  (long)new_nodes[3],
                                                  (ulong)(uint)pRVar1[new_nodes[3]]);
                                              ref_node_location(pRVar2,new_nodes[0]);
                                              ref_node_location(pRVar2,new_nodes[1]);
                                              ref_node_location(pRVar2,new_nodes[2]);
                                              ref_node_location(pRVar2,new_nodes[3]);
                                              ref_node = pRVar2;
                                            }
                                            new_nodes[1] = (REF_INT)local_178;
                                            new_nodes[0] = RVar7;
                                            new_nodes[3] = RVar6;
                                            new_nodes[2] = RVar3;
                                            uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell)
                                            ;
                                            if (uVar8 == 0) {
                                              uVar8 = ref_node_tet_vol(ref_node,new_nodes,&volume);
                                              pRVar2 = local_170;
                                              uVar13 = local_180;
                                              if (uVar8 == 0) {
                                                if (volume < ref_node->min_volume) {
                                                  pRVar1 = local_170->part;
                                                  local_178 = (ulong)(uint)pRVar1[new_nodes[2]];
                                                  printf(
                                                  "%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n"
                                                  ,local_180 & 0xffffffff,0x3f,
                                                  (ulong)(uint)local_170->ref_mpi->id,
                                                  (long)new_nodes[0],
                                                  (ulong)(uint)pRVar1[new_nodes[0]],
                                                  (long)new_nodes[1],
                                                  (ulong)(uint)pRVar1[new_nodes[1]],
                                                  (long)new_nodes[2],local_178,(long)new_nodes[3],
                                                  (ulong)(uint)pRVar1[new_nodes[3]]);
                                                  ref_node_location(pRVar2,new_nodes[0]);
                                                  ref_node_location(pRVar2,new_nodes[1]);
                                                  ref_node_location(pRVar2,new_nodes[2]);
                                                  ref_node_location(pRVar2,new_nodes[3]);
                                                }
                                                goto LAB_001c9e08;
                                              }
                                              pcVar15 = "edge split vol";
                                            }
                                            else {
                                              pcVar15 = "add";
                                            }
                                            uVar12 = 0x6f6;
                                            goto LAB_001c8f80;
                                          }
                                          pcVar15 = "edge split vol";
                                        }
                                        else {
                                          pcVar15 = "add";
                                        }
                                        uVar12 = 0x6f5;
                                        goto LAB_001c8f80;
                                      }
                                      pcVar15 = "edge split vol";
                                    }
                                    else {
                                      pcVar15 = "add";
                                    }
                                    uVar12 = 0x6f4;
                                    goto LAB_001c8f80;
                                  }
                                  pcVar15 = "edge split vol";
                                }
                                else {
                                  pcVar15 = "add";
                                }
                                uVar12 = 0x6f3;
                                goto LAB_001c8f80;
                              }
                              pcVar15 = "edge split vol";
                            }
                            else {
                              pcVar15 = "add";
                            }
                            uVar12 = 0x6f2;
                            goto LAB_001c8f80;
                          }
                          pcVar15 = "edge split vol";
                        }
                        else {
                          pcVar15 = "add";
                        }
                        uVar12 = 0x6f1;
                        goto LAB_001c8f80;
                      }
                      pcVar15 = "edge split vol";
                    }
                    else {
                      pcVar15 = "add";
                    }
                    uVar12 = 0x6f0;
                    goto LAB_001c8f80;
                  }
                  pcVar15 = "edge split vol";
                }
                else {
                  pcVar15 = "add";
                }
                uVar12 = 0x6ef;
                goto LAB_001c8f80;
              }
              *(undefined4 *)((long)__s + local_180 * 4) = 1;
              RVar9 = RStack_a4;
              RVar4 = RStack_a4;
              RVar5 = local_a8;
              RVar6 = RStack_a4;
              RVar7 = RStack_a0;
              if (((map != 0x15) &&
                  (RVar14 = RStack_9c, RVar9 = RStack_a0, RVar4 = RStack_a0, RVar5 = RStack_a4,
                  RVar6 = local_a8, RVar7 = RStack_a4, map != 0x26)) &&
                 (RVar14 = RStack_a0, RVar9 = RStack_9c, RVar4 = RStack_a4, RVar5 = RStack_a0,
                 RVar6 = RStack_a4, RVar7 = local_a8, map != 0x38)) {
                RVar14 = RStack_a4;
                RVar9 = local_a8;
                RVar4 = local_a8;
                RVar5 = RStack_a4;
                RVar6 = RStack_a0;
                RVar7 = RStack_9c;
              }
              RStack_9c = RVar7;
              RStack_a0 = RVar6;
              RStack_a4 = RVar5;
              local_a8 = RVar4;
              pRVar1 = new_nodes + 1;
              new_node = new_nodes + 2;
              new_nodes[1] = RStack_a4;
              new_nodes[0] = local_a8;
              new_nodes[3] = RStack_9c;
              new_nodes[2] = RStack_a0;
              uVar8 = ref_subdiv_node_between(ref_subdiv,RVar9,RVar14,pRVar1);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6ad;
                goto LAB_001c8f80;
              }
              uVar8 = ref_subdiv_node_between(ref_subdiv,local_a8,RStack_a0,new_node);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6b0;
                goto LAB_001c8f80;
              }
              uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
              if (uVar8 != 0) {
                pcVar15 = "add";
                uVar12 = 0x6b1;
                goto LAB_001c8f80;
              }
              new_nodes[1] = RStack_a4;
              new_nodes[0] = local_a8;
              new_nodes[3] = RStack_9c;
              new_nodes[2] = RStack_a0;
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a4,local_a8,new_nodes);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6b7;
                goto LAB_001c8f80;
              }
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a4,RStack_a0,new_node);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6ba;
                goto LAB_001c8f80;
              }
              uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
              if (uVar8 != 0) {
                pcVar15 = "add";
                uVar12 = 0x6bb;
                goto LAB_001c8f80;
              }
              new_nodes[1] = RStack_a4;
              new_nodes[0] = local_a8;
              new_nodes[3] = RStack_9c;
              new_nodes[2] = RStack_a0;
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a0,local_a8,new_nodes);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6c1;
                goto LAB_001c8f80;
              }
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a0,RStack_a4,pRVar1);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6c4;
                goto LAB_001c8f80;
              }
              uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
              if (uVar8 != 0) {
                pcVar15 = "add";
                uVar12 = 0x6c5;
                goto LAB_001c8f80;
              }
              new_nodes[1] = RStack_a4;
              new_nodes[0] = local_a8;
              new_nodes[3] = RStack_9c;
              new_nodes[2] = RStack_a0;
              uVar8 = ref_subdiv_node_between(ref_subdiv,local_a8,RStack_a4,new_nodes);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6cb;
                goto LAB_001c8f80;
              }
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a4,RStack_a0,pRVar1);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6ce;
                goto LAB_001c8f80;
              }
              uVar8 = ref_subdiv_node_between(ref_subdiv,RStack_a0,local_a8,new_node);
              if (uVar8 != 0) {
                pcVar15 = "mis";
                uVar12 = 0x6d1;
                goto LAB_001c8f80;
              }
              uVar8 = ref_cell_add(ref_cell_split,new_nodes,&new_cell);
              uVar13 = local_180;
              if (uVar8 != 0) {
                pcVar15 = "add";
                uVar12 = 0x6d2;
                goto LAB_001c8f80;
              }
            }
            else {
LAB_001c9bce:
              if (map != 0) {
                ref_subdiv_map_to_edge(map);
                printf("tet %d, map %d\n",uVar13 & 0xffffffff,(ulong)map);
                pcVar15 = "map not implemented yet";
                uVar8 = 6;
                uVar12 = 0x6fb;
                uVar13 = 6;
                goto LAB_001c8f83;
              }
            }
LAB_001c9e08:
            uVar13 = uVar13 + 1;
            uVar11 = (ulong)ref_cell->max;
          } while ((long)uVar13 < (long)uVar11);
          if (0 < ref_cell->max) {
            lVar17 = 0;
            do {
              if (*(int *)((long)__s + lVar17 * 4) == 1) {
                uVar8 = ref_cell_remove(ref_cell,(REF_INT)lVar17);
                if (uVar8 != 0) {
                  pcVar15 = "remove";
                  uVar12 = 0x701;
                  goto LAB_001c8f80;
                }
                uVar11 = (ulong)(uint)ref_cell->max;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)uVar11);
          }
        }
        if (0 < ref_cell_split->max) {
          iVar16 = 0;
          do {
            RVar10 = ref_cell_nodes(ref_cell_split,iVar16,&local_a8);
            if ((RVar10 == 0) &&
               (uVar8 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,ref_cell,&local_a8),
               uVar8 != 0)) {
              pcVar15 = "add local";
              uVar12 = 0x704;
              goto LAB_001c8f80;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < ref_cell_split->max);
        }
        uVar8 = ref_cell_free(ref_cell_split);
        if (uVar8 == 0) {
          free(__s);
          return 0;
        }
        pcVar15 = "temp ref_cell free";
        uVar12 = 0x706;
      }
      else {
        pcVar15 = "temp cell";
        uVar12 = 0x672;
      }
LAB_001c8f80:
      uVar13 = (ulong)uVar8;
LAB_001c8f83:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar12,"ref_subdiv_split_tet",uVar13,pcVar15);
    }
  }
  return uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  REF_INT edge, split_edge, global_edge;
  REF_INT n0, n1, n2, n3;
  REF_INT e0, e1, e2, e3, e4, e5;

  REF_INT node;
  REF_DBL volume;

  ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
        split_edge = REF_EMPTY;
        for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++)
          if (ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)))
            split_edge = edge;
        RAS(REF_EMPTY != split_edge, "edge not found");
        global_edge = ref_subdiv_c2e(ref_subdiv, ref_cell, split_edge, cell);

        marked_for_removal[cell] = 1;

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 0, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 1, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      case 11:
      case 56:
      case 38:
      case 21:
        /* orient cell for other cases */

        marked_for_removal[cell] = 1;

        if (56 == map) {
          node_swap(nodes, 0, 3);
          node_swap(nodes, 1, 2);
        }
        if (38 == map) {
          node_swap(nodes, 1, 3);
          node_swap(nodes, 0, 2);
        }
        if (21 == map) {
          node_swap(nodes, 2, 3);
          node_swap(nodes, 0, 1);
        }

        /* near node 0 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 1 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 2 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      /*
                          inode3------5------inode2
                             / \              . /
                            /   \          .   /
                           /     \      .     /
                          /       \  .       /
                         /        .\        /
                        2      1    4      3
                       /    .        \    /
                      /  .            \  /
                     /.                \/
                  inode0------0------inode1
       */
      case 63:
        marked_for_removal[cell] = 1;

        n0 = nodes[0];
        n1 = nodes[1];
        n2 = nodes[2];
        n3 = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1], &e0), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2], &e1), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3], &e2), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2], &e3), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[3], &e4), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3], &e5), "e");
        add_cell_with(e0, e2, e1, n0);
        add_cell_with(e0, e3, e4, n1);
        add_cell_with(e1, e5, e3, n2);
        add_cell_with(e2, e4, e5, n3);
        add_cell_with(e0, e5, e1, e2);
        add_cell_with(e0, e5, e2, e4);
        add_cell_with(e0, e5, e4, e3);
        add_cell_with(e0, e5, e3, e1);
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("tet %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}